

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O2

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setup(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  int *piVar1;
  undefined8 *puVar2;
  uint *puVar3;
  pointer pnVar4;
  bool bVar5;
  type_conflict5 tVar6;
  ulong uVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  ulong uVar8;
  ulong uVar9;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined1 local_ac;
  undefined8 local_a8;
  cpp_dec_float<50U,_int,_void> local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  if (this->setupStatus == false) {
    uVar7 = ((long)(this->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x38;
    (this->super_IdxSet).num = 0;
    uVar8 = 0;
    uVar9 = uVar7 & 0xffffffff;
    if ((int)uVar7 < 1) {
      uVar9 = uVar8;
    }
    for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      pnVar4 = (this->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_a0,0,(type *)0x0);
      bVar5 = boost::multiprecision::operator!=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&(pnVar4->m_backend).data + uVar8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_a0);
      if (bVar5) {
        pnVar4 = (this->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_b8 = *(undefined8 *)((long)&(pnVar4->m_backend).data + uVar8 + 0x20);
        puVar2 = (undefined8 *)((long)&(pnVar4->m_backend).data + uVar8);
        local_d8 = *puVar2;
        uStack_d0 = puVar2[1];
        puVar2 = (undefined8 *)((long)&(pnVar4->m_backend).data + uVar8 + 0x10);
        local_c8 = *puVar2;
        uStack_c0 = puVar2[1];
        local_b0 = *(undefined4 *)((long)&(pnVar4->m_backend).data + uVar8 + 0x28);
        local_ac = *(undefined1 *)((long)&(pnVar4->m_backend).data + uVar8 + 0x2c);
        local_a8 = *(undefined8 *)((long)&(pnVar4->m_backend).data + uVar8 + 0x30);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&local_a0,(multiprecision *)&local_d8,arg);
        getEpsilon(&local_68,this);
        tVar6 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_a0,&local_68);
        if (tVar6) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_a0,0,(type *)0x0);
          pnVar4 = (this->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&(pnVar4->m_backend).data + uVar8 + 0x20) =
               local_a0.data._M_elems._32_8_;
          puVar3 = (uint *)((long)&(pnVar4->m_backend).data + uVar8 + 0x10);
          *(undefined8 *)puVar3 = local_a0.data._M_elems._16_8_;
          *(undefined8 *)(puVar3 + 2) = local_a0.data._M_elems._24_8_;
          puVar3 = (uint *)((long)&(pnVar4->m_backend).data + uVar8);
          *(undefined8 *)puVar3 = local_a0.data._M_elems._0_8_;
          *(undefined8 *)(puVar3 + 2) = local_a0.data._M_elems._8_8_;
          *(int *)((long)&(pnVar4->m_backend).data + uVar8 + 0x28) = local_a0.exp;
          *(bool *)((long)&(pnVar4->m_backend).data + uVar8 + 0x2c) = local_a0.neg;
          *(undefined8 *)((long)&(pnVar4->m_backend).data + uVar8 + 0x30) = local_a0._48_8_;
        }
        else {
          (this->super_IdxSet).idx[(this->super_IdxSet).num] = (int)uVar7;
          piVar1 = &(this->super_IdxSet).num;
          *piVar1 = *piVar1 + 1;
        }
      }
      uVar8 = uVar8 + 0x38;
    }
    this->setupStatus = true;
  }
  return;
}

Assistant:

void setup()
   {
      if(!isSetup())
      {
         IdxSet::clear();

         int d = dim();
         num = 0;

         for(int i = 0; i < d; ++i)
         {
            if(VectorBase<R>::val[i] != R(0))
            {
               if(spxAbs(VectorBase<R>::val[i]) <= this->getEpsilon())
                  VectorBase<R>::val[i] = R(0);
               else
               {
                  idx[num] = i;
                  num++;
               }
            }
         }

         setupStatus = true;

         assert(isConsistent());
      }
   }